

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

uint RDL_getEdgesForRCF(RDL_data *data,uint index,RDL_edge **ptr)

{
  uint **ppuVar1;
  uint uVar2;
  void *__ptr;
  uint *__ptr_00;
  RDL_edge *paRVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint *puVar7;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (index < data->nofRCFs) {
      __ptr = malloc(0x200);
      __ptr_00 = RDL_getEdgesRCF(data,index);
      uVar4 = *__ptr_00;
      if (uVar4 == 0xffffffff) {
        uVar6 = 0;
      }
      else {
        uVar2 = 0x40;
        uVar5 = 0;
        uVar6 = 0;
        puVar7 = __ptr_00;
        do {
          if ((uint)uVar6 == uVar2) {
            __ptr = realloc(__ptr,(ulong)uVar5 << 3);
            uVar4 = *puVar7;
            uVar2 = uVar5;
          }
          ppuVar1 = data->graph->edges;
          *(uint *)((long)__ptr + uVar6 * 8) = *ppuVar1[uVar4];
          *(uint *)((long)__ptr + uVar6 * 8 + 4) = ppuVar1[*puVar7][1];
          uVar6 = (ulong)((uint)uVar6 + 1);
          puVar7 = __ptr_00 + uVar6;
          uVar4 = __ptr_00[uVar6];
          uVar5 = uVar5 + 2;
        } while (uVar4 != 0xffffffff);
      }
      uVar4 = (uint)uVar6;
      paRVar3 = (RDL_edge *)realloc(__ptr,uVar6 << 3);
      free(__ptr_00);
      goto LAB_001074c8;
    }
    (*RDL_outputFunc)(RDL_ERROR,"invalid index: %u\n",index);
  }
  paRVar3 = (RDL_edge *)malloc(8);
  uVar4 = 0xffffffff;
LAB_001074c8:
  *ptr = paRVar3;
  return uVar4;
}

Assistant:

unsigned RDL_getEdgesForRCF(const RDL_data *data, unsigned index, RDL_edge **ptr)
{
  unsigned nextfree, alloced;
  RDL_edge *result;
  unsigned *edgeIndices;
  unsigned i;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (index >= data->nofRCFs) {
    RDL_outputFunc(RDL_ERROR, "invalid index: %u\n", index);
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  nextfree = 0;
  alloced = RDL_RESERVED_START;
  result = malloc(alloced * sizeof(*result));
  edgeIndices = RDL_getEdgesRCF(data, index);
  /* translate result from edge indices to edges */
  for(i=0; edgeIndices[i]<UINT_MAX; ++i)
  {
    if(nextfree == alloced)/*more space needed in result*/
    {
      alloced *= 2; /* double the space */
      result = realloc(result, alloced * sizeof(*result));
    }
    result[nextfree][0] = data->graph->edges[edgeIndices[i]][0];
    result[nextfree][1] = data->graph->edges[edgeIndices[i]][1];
    ++nextfree;
  }
  result = realloc(result, nextfree * sizeof(*result));
  free(edgeIndices);
  (*ptr) = result;
  return nextfree;
}